

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O3

bool __thiscall tsip::send_request_msg(tsip *this,_command_packet _cmd)

{
  undefined1 uVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  size_t __n;
  ulong __n_00;
  long lVar5;
  byte local_128 [256];
  
  uVar2 = _cmd._64_4_;
  local_128[0] = 0x10;
  uVar1 = _cmd.raw.cmd_len;
  __n_00 = (ulong)_cmd.raw.cmd_len;
  _cmd._64_4_ = uVar2;
  if (_cmd.raw.cmd_len == '\0') {
    uVar3 = 1;
  }
  else {
    memcpy(local_128 + 1,&_cmd,__n_00);
    uVar3 = (byte)uVar1 + 1;
  }
  (local_128 + uVar3)[0] = 0x10;
  (local_128 + uVar3)[1] = 3;
  __n = (ulong)uVar3 + 1;
  sVar4 = fwrite(local_128,1,__n,(FILE *)this->file);
  if (this->verbose == true) {
    printf("Sending Request: ");
    lVar5 = 0;
    do {
      printf(" %x",(ulong)local_128[lVar5]);
      lVar5 = lVar5 + 1;
    } while (__n_00 + 3 != lVar5);
    putchar(10);
  }
  return (int)__n == (int)sVar4;
}

Assistant:

bool tsip::send_request_msg(_command_packet _cmd) {

	unsigned char buffer[256];
	buffer[0] = DLE;
	int x = 1;
	for (int j=0; j < _cmd.raw.cmd_len; j++,x++){
		buffer[x] = _cmd.raw.data[j];
	}
	buffer[x] = DLE;
	buffer[x+1] = ETX;
	int byte_cnt = fwrite(buffer, 1, x+1, file);
	if (verbose) {
		printf("Sending Request: ");
		for (int k=0;k<=x+1;k++){printf(" %x",buffer[k]);}
		printf("\n");
	}

	return (byte_cnt == x+1 ? true : false);
}